

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void add_name(char *name)

{
  uint *puVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_handle *pUVar3;
  UT_hash_table *pUVar4;
  UT_hash_bucket *pUVar5;
  UT_hash_handle *pUVar6;
  UT_hash_handle *pUVar7;
  lookup_t *plVar8;
  uint uVar9;
  lookup_t *plVar10;
  size_t sVar11;
  byte *__dest;
  UT_hash_table *pUVar12;
  UT_hash_bucket *pUVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  UT_hash_handle *pUVar20;
  uchar *_hj_key;
  
  plVar10 = (lookup_t *)malloc(0x40);
  if (plVar10 == (lookup_t *)0x0) {
    add_name_cold_2();
  }
  else {
    plVar10->name = (char *)0x0;
    sVar11 = strlen(name);
    __dest = (byte *)malloc(sVar11 * 8 + 8);
    plVar10->name = (char *)__dest;
    if (__dest != (byte *)0x0) {
      strncpy((char *)__dest,name,sVar11 + 1);
      pUVar20 = &plVar10->hh;
      (plVar10->hh).next = (void *)0x0;
      (plVar10->hh).key = __dest;
      sVar11 = strlen((char *)__dest);
      (plVar10->hh).keylen = (uint)sVar11;
      if (lookup == (lookup_t *)0x0) {
        lookup = plVar10;
        (plVar10->hh).prev = (void *)0x0;
        pUVar12 = (UT_hash_table *)malloc(0x40);
        (plVar10->hh).tbl = pUVar12;
        if (pUVar12 == (UT_hash_table *)0x0) goto LAB_00103d61;
        *(undefined8 *)&pUVar12->num_items = 0;
        pUVar12->tail = (UT_hash_handle *)0x0;
        pUVar12->buckets = (UT_hash_bucket *)0x0;
        pUVar12->num_buckets = 0;
        pUVar12->log2_num_buckets = 0;
        pUVar12->hho = 0;
        pUVar12->ideal_chain_maxlen = 0;
        pUVar12->nonideal_items = 0;
        pUVar12->ineff_expands = 0;
        pUVar12->noexpand = 0;
        *(undefined8 *)&pUVar12->signature = 0;
        pUVar12->tail = pUVar20;
        pUVar12->num_buckets = 0x20;
        pUVar12->log2_num_buckets = 5;
        pUVar12->hho = 8;
        pUVar13 = (UT_hash_bucket *)malloc(0x200);
        pUVar12->buckets = pUVar13;
        if (pUVar13 == (UT_hash_bucket *)0x0) goto LAB_00103d61;
        memset(pUVar13,0,0x200);
        pUVar12->signature = 0xa0111fe1;
      }
      else {
        pUVar12 = (lookup->hh).tbl;
        pUVar3 = pUVar12->tail;
        pUVar3->next = plVar10;
        (plVar10->hh).prev = (void *)((long)pUVar3 - pUVar12->hho);
        pUVar12->tail = pUVar20;
      }
      plVar8 = lookup;
      pUVar12 = (lookup->hh).tbl;
      pUVar12->num_items = pUVar12->num_items + 1;
      (plVar10->hh).tbl = pUVar12;
      (plVar10->hh).hashv = 0xfeedbeef;
      sVar11 = strlen((char *)__dest);
      uVar14 = 0x9e3779b9;
      uVar9 = (uint)sVar11;
      if (uVar9 < 0xc) {
        uVar18 = 0x9e3779b9;
        uVar15 = uVar9;
      }
      else {
        uVar17 = (plVar10->hh).hashv;
        uVar18 = 0x9e3779b9;
        uVar14 = 0x9e3779b9;
        uVar19 = sVar11 & 0xffffffff;
        do {
          uVar17 = uVar17 + *(int *)(__dest + 8);
          uVar18 = uVar17 >> 0xd ^
                   ((uVar18 + *(int *)__dest) - (uVar14 + *(int *)(__dest + 4))) - uVar17;
          uVar15 = uVar18 << 8 ^ ((uVar14 + *(int *)(__dest + 4)) - uVar17) - uVar18;
          uVar14 = uVar15 >> 0xd ^ (uVar17 - uVar18) - uVar15;
          uVar18 = uVar14 >> 0xc ^ (uVar18 - uVar15) - uVar14;
          uVar15 = uVar18 << 0x10 ^ (uVar15 - uVar14) - uVar18;
          uVar17 = uVar15 >> 5 ^ (uVar14 - uVar18) - uVar15;
          uVar18 = uVar17 >> 3 ^ (uVar18 - uVar15) - uVar17;
          uVar14 = uVar18 << 10 ^ (uVar15 - uVar17) - uVar18;
          uVar17 = uVar14 >> 0xf ^ (uVar17 - uVar18) - uVar14;
          __dest = __dest + 0xc;
          uVar15 = (int)uVar19 - 0xc;
          uVar19 = (ulong)uVar15;
        } while (0xb < uVar15);
        (plVar10->hh).hashv = uVar17;
      }
      uVar9 = uVar9 + (plVar10->hh).hashv;
      (plVar10->hh).hashv = uVar9;
      switch(uVar15) {
      case 0xb:
        (plVar10->hh).hashv = (uint)__dest[10] * 0x1000000 + uVar9;
      case 10:
        puVar1 = &(plVar10->hh).hashv;
        *puVar1 = *puVar1 + (uint)__dest[9] * 0x10000;
      case 9:
        puVar1 = &(plVar10->hh).hashv;
        *puVar1 = *puVar1 + (uint)__dest[8] * 0x100;
      case 8:
        uVar14 = (uint)__dest[7] * 0x1000000 + uVar14;
      case 7:
        uVar14 = (uint)__dest[6] * 0x10000 + uVar14;
      case 6:
        uVar14 = (uint)__dest[5] * 0x100 + uVar14;
      case 5:
        uVar14 = __dest[4] + uVar14;
      case 4:
        uVar18 = (uint)__dest[3] * 0x1000000 + uVar18;
      case 3:
        uVar18 = (uint)__dest[2] * 0x10000 + uVar18;
      case 2:
        uVar18 = (uint)__dest[1] * 0x100 + uVar18;
      case 1:
        uVar18 = *__dest + uVar18;
      }
      uVar9 = (plVar10->hh).hashv;
      uVar18 = uVar9 >> 0xd ^ (uVar18 - uVar14) - uVar9;
      uVar15 = uVar18 << 8 ^ (uVar14 - uVar9) - uVar18;
      uVar14 = uVar15 >> 0xd ^ (uVar9 - uVar18) - uVar15;
      uVar9 = uVar14 >> 0xc ^ (uVar18 - uVar15) - uVar14;
      uVar15 = uVar9 << 0x10 ^ (uVar15 - uVar14) - uVar9;
      uVar14 = uVar15 >> 5 ^ (uVar14 - uVar9) - uVar15;
      uVar9 = uVar14 >> 3 ^ (uVar9 - uVar15) - uVar14;
      uVar15 = uVar9 << 10 ^ (uVar15 - uVar14) - uVar9;
      uVar9 = uVar15 >> 0xf ^ uVar14 - (uVar9 + uVar15);
      (plVar10->hh).hashv = uVar9;
      pUVar4 = (plVar8->hh).tbl;
      uVar9 = pUVar4->num_buckets - 1 & uVar9;
      pUVar13 = pUVar4->buckets;
      pUVar13[uVar9].count = pUVar13[uVar9].count + 1;
      pUVar3 = pUVar13[uVar9].hh_head;
      (plVar10->hh).hh_next = pUVar3;
      (plVar10->hh).hh_prev = (UT_hash_handle *)0x0;
      if (pUVar3 != (UT_hash_handle *)0x0) {
        pUVar3->hh_prev = pUVar20;
      }
      pUVar13[uVar9].hh_head = pUVar20;
      pUVar13 = ((lookup->hh).tbl)->buckets;
      if ((pUVar13[uVar9].count < pUVar13[uVar9].expand_mult * 10 + 10) || (pUVar12->noexpand == 1))
      {
        return;
      }
      sVar11 = (ulong)(pUVar12->num_buckets * 2) << 4;
      pUVar13 = (UT_hash_bucket *)malloc(sVar11);
      if (pUVar13 != (UT_hash_bucket *)0x0) {
        uVar14 = 0;
        memset(pUVar13,0,sVar11);
        uVar9 = pUVar12->num_buckets;
        uVar18 = uVar9 * 2 - 1;
        uVar15 = ((pUVar12->num_items >> ((char)pUVar12->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar18 & pUVar12->num_items) == 0);
        pUVar12->ideal_chain_maxlen = uVar15;
        pUVar12->nonideal_items = 0;
        if ((ulong)uVar9 != 0) {
          pUVar5 = pUVar12->buckets;
          uVar19 = 0;
          do {
            pUVar3 = pUVar5[uVar19].hh_head;
            while (pUVar3 != (UT_hash_handle *)0x0) {
              pUVar6 = pUVar3->hh_next;
              uVar16 = pUVar3->hashv & uVar18;
              pUVar2 = pUVar13 + uVar16;
              uVar17 = pUVar13[uVar16].count + 1;
              pUVar13[uVar16].count = uVar17;
              if (uVar15 < uVar17) {
                pUVar12->nonideal_items = pUVar12->nonideal_items + 1;
                pUVar2->expand_mult = uVar17 / uVar15;
              }
              pUVar3->hh_prev = (UT_hash_handle *)0x0;
              pUVar7 = pUVar2->hh_head;
              pUVar3->hh_next = pUVar7;
              if (pUVar7 != (UT_hash_handle *)0x0) {
                pUVar7->hh_prev = pUVar3;
              }
              pUVar2->hh_head = pUVar3;
              pUVar3 = pUVar6;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar9);
        }
        free(pUVar12->buckets);
        pUVar12 = pUVar20->tbl;
        pUVar12->num_buckets = pUVar12->num_buckets << 1;
        pUVar12->log2_num_buckets = pUVar12->log2_num_buckets + 1;
        pUVar12->buckets = pUVar13;
        if (pUVar12->num_items >> 1 < pUVar12->nonideal_items) {
          uVar14 = pUVar12->ineff_expands + 1;
        }
        pUVar12->ineff_expands = uVar14;
        if (uVar14 < 2) {
          return;
        }
        pUVar12->noexpand = 1;
        return;
      }
      goto LAB_00103d61;
    }
  }
  add_name_cold_1();
LAB_00103d61:
  exit(-1);
}

Assistant:

void add_name(char *name)
{
	lookup_t *s;
	s = (lookup_t *)malloc(sizeof(lookup_t));
	if (s == NULL) {
		fprintf(stderr,"couldn't get memory for lookup_t\n");
		exit(EXIT_FAILURE);
	} else {
		s->name = NULL;
	}
	s->name = (char *)malloc(sizeof(char *) * (strlen(name)+1));
	if (s->name == NULL) {
		fprintf(stderr,"couldn't get memory for name string\n");
		exit(EXIT_FAILURE);
	}
	strncpy(s->name,name,strlen(name)+1);

	HASH_ADD_KEYPTR( hh, lookup, s->name, strlen(s->name), s );
}